

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_movem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  ushort uVar1;
  uint16_t uVar2;
  int opsize_00;
  uint32_t mode_00;
  uint reg0_00;
  int iVar3;
  TCGv_i32 ret;
  TCGv_i32 arg2;
  TCGv_i32 pTVar4;
  int local_e0;
  int i;
  int reg0;
  int mode;
  uint16_t mask;
  int opsize;
  int is_load;
  TCGv_i32 r [16];
  TCGv_i32 local_40;
  TCGv_i32 tmp;
  TCGv_i32 incr;
  TCGv_i32 addr;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = insn >> 10;
  opsize_00 = ((insn & 0x40) >> 6) + 1;
  uVar2 = read_im16(env,s);
  mode_00 = extract32((uint)insn,3,3);
  reg0_00 = insn & 7;
  local_40 = tcg_ctx_00->cpu_aregs[(int)reg0_00];
  switch(mode_00) {
  case 0:
  case 1:
    break;
  case 2:
LAB_008c3bdf:
    ret = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_mov_i32(tcg_ctx_00,ret,local_40);
    iVar3 = opsize_bytes(opsize_00);
    arg2 = tcg_const_i32_m68k(tcg_ctx_00,iVar3);
    if ((uVar1 & 1) == 0) {
      if (mode_00 == 4) {
        for (local_e0 = 0xf; -1 < local_e0; local_e0 = local_e0 + -1) {
          if (((uint)uVar2 << ((byte)local_e0 & 0x1f) & 0x8000) != 0) {
            tcg_gen_sub_i32(tcg_ctx_00,ret,ret,arg2);
            if ((reg0_00 + 8 == local_e0) && (iVar3 = m68k_feature(s->env,0xe), iVar3 != 0)) {
              pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_sub_i32(tcg_ctx_00,pTVar4,tcg_ctx_00->cpu_aregs[(int)reg0_00],arg2);
              gen_store(s,opsize_00,ret,pTVar4,
                        (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
              tcg_temp_free_i32(tcg_ctx_00,pTVar4);
            }
            else {
              pTVar4 = mreg(tcg_ctx_00,local_e0);
              gen_store(s,opsize_00,ret,pTVar4,
                        (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
            }
          }
        }
        tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_aregs[(int)reg0_00],ret);
      }
      else {
        for (local_e0 = 0; local_e0 < 0x10; local_e0 = local_e0 + 1) {
          if (((uint)uVar2 & 1 << ((byte)local_e0 & 0x1f)) != 0) {
            pTVar4 = mreg(tcg_ctx_00,local_e0);
            gen_store(s,opsize_00,ret,pTVar4,
                      (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
            tcg_gen_add_i32(tcg_ctx_00,ret,ret,arg2);
          }
        }
      }
    }
    else {
      for (local_e0 = 0; local_e0 < 0x10; local_e0 = local_e0 + 1) {
        if (((uint)uVar2 & 1 << ((byte)local_e0 & 0x1f)) != 0) {
          pTVar4 = gen_load(s,opsize_00,ret,1,
                            (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
          *(TCGv_i32 *)(&opsize + (long)local_e0 * 2) = pTVar4;
          tcg_gen_add_i32(tcg_ctx_00,ret,ret,arg2);
        }
      }
      for (local_e0 = 0; local_e0 < 0x10; local_e0 = local_e0 + 1) {
        if (((uint)uVar2 & 1 << ((byte)local_e0 & 0x1f)) != 0) {
          pTVar4 = mreg(tcg_ctx_00,local_e0);
          tcg_gen_mov_i32(tcg_ctx_00,pTVar4,*(TCGv_i32 *)(&opsize + (long)local_e0 * 2));
          tcg_temp_free_i32(tcg_ctx_00,*(TCGv_i32 *)(&opsize + (long)local_e0 * 2));
        }
      }
      if (mode_00 == 3) {
        tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_aregs[(int)reg0_00],ret);
      }
    }
    tcg_temp_free_i32(tcg_ctx_00,arg2);
    tcg_temp_free_i32(tcg_ctx_00,ret);
    return;
  case 3:
    if ((uVar1 & 1) != 0) goto LAB_008c3bdf;
    break;
  case 4:
    if ((uVar1 & 1) == 0) goto LAB_008c3bdf;
    break;
  default:
    local_40 = gen_lea_mode(env,s,mode_00,reg0_00,opsize_00);
    if (local_40 != tcg_ctx_00->NULL_QREG) goto LAB_008c3bdf;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(movem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr, incr, tmp, r[16];
    int is_load = (insn & 0x0400) != 0;
    int opsize = (insn & 0x40) != 0 ? OS_LONG : OS_WORD;
    uint16_t mask = read_im16(env, s);
    int mode = extract32(insn, 3, 3);
    int reg0 = REG(insn, 0);
    int i;

    tmp = tcg_ctx->cpu_aregs[reg0];

    switch (mode) {
    case 0: /* data register direct */
    case 1: /* addr register direct */
    do_addr_fault:
        gen_addr_fault(s);
        return;

    case 2: /* indirect */
        break;

    case 3: /* indirect post-increment */
        if (!is_load) {
            /* post-increment is not allowed */
            goto do_addr_fault;
        }
        break;

    case 4: /* indirect pre-decrement */
        if (is_load) {
            /* pre-decrement is not allowed */
            goto do_addr_fault;
        }
        /*
         * We want a bare copy of the address reg, without any pre-decrement
         * adjustment, as gen_lea would provide.
         */
        break;

    default:
        tmp = gen_lea_mode(env, s, mode, reg0, opsize);
        if (IS_NULL_QREG(tmp)) {
            goto do_addr_fault;
        }
        break;
    }

    addr = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, addr, tmp);
    incr = tcg_const_i32(tcg_ctx, opsize_bytes(opsize));

    if (is_load) {
        /* memory to register */
        for (i = 0; i < 16; i++) {
            if (mask & (1 << i)) {
                r[i] = gen_load(s, opsize, addr, 1, IS_USER(s));
                tcg_gen_add_i32(tcg_ctx, addr, addr, incr);
            }
        }
        for (i = 0; i < 16; i++) {
            if (mask & (1 << i)) {
                tcg_gen_mov_i32(tcg_ctx, mreg(tcg_ctx, i), r[i]);
                tcg_temp_free(tcg_ctx, r[i]);
            }
        }
        if (mode == 3) {
            /* post-increment: movem (An)+,X */
            tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_aregs[reg0], addr);
        }
    } else {
        /* register to memory */
        if (mode == 4) {
            /* pre-decrement: movem X,-(An) */
            for (i = 15; i >= 0; i--) {
                if ((mask << i) & 0x8000) {
                    tcg_gen_sub_i32(tcg_ctx, addr, addr, incr);
                    if (reg0 + 8 == i &&
                        m68k_feature(s->env, M68K_FEATURE_EXT_FULL)) {
                        /*
                         * M68020+: if the addressing register is the
                         * register moved to memory, the value written
                         * is the initial value decremented by the size of
                         * the operation, regardless of how many actual
                         * stores have been performed until this point.
                         * M68000/M68010: the value is the initial value.
                         */
                        tmp = tcg_temp_new(tcg_ctx);
                        tcg_gen_sub_i32(tcg_ctx, tmp, tcg_ctx->cpu_aregs[reg0], incr);
                        gen_store(s, opsize, addr, tmp, IS_USER(s));
                        tcg_temp_free(tcg_ctx, tmp);
                    } else {
                        gen_store(s, opsize, addr, mreg(tcg_ctx, i), IS_USER(s));
                    }
                }
            }
            tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_aregs[reg0], addr);
        } else {
            for (i = 0; i < 16; i++) {
                if (mask & (1 << i)) {
                    gen_store(s, opsize, addr, mreg(tcg_ctx, i), IS_USER(s));
                    tcg_gen_add_i32(tcg_ctx, addr, addr, incr);
                }
            }
        }
    }

    tcg_temp_free(tcg_ctx, incr);
    tcg_temp_free(tcg_ctx, addr);
}